

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::RandomizedRenderGrid
          (RandomizedRenderGrid *this,IVec2 *targetSize,IVec2 *cellSize,int maxCellCount,
          deUint32 seed)

{
  int iVar1;
  int i;
  deUint32 dVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  IVec2 extraSpace;
  Vector<int,_2> res;
  Random rng;
  int local_60 [2];
  undefined8 local_58;
  undefined8 local_50;
  int local_48 [2];
  undefined8 local_40;
  deRandom local_38;
  
  lVar3 = 0;
  do {
    (this->m_targetSize).m_data[lVar3] = targetSize->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  lVar3 = 0;
  do {
    (this->m_cellSize).m_data[lVar3] = cellSize->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  *(undefined8 *)(this->m_grid).m_data = 0;
  lVar3 = 0;
  do {
    (this->m_grid).m_data[lVar3] = targetSize->m_data[lVar3] / cellSize->m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  this->m_currentCell = 0;
  if ((targetSize->m_data[1] % cellSize->m_data[1] == 0) &&
     (iVar4 = (this->m_grid).m_data[1], 1 < iVar4)) {
    iVar4 = iVar4 + -1;
  }
  else {
    iVar4 = (this->m_grid).m_data[1];
  }
  iVar4 = iVar4 * (this->m_grid).m_data[0];
  if (maxCellCount < iVar4) {
    iVar4 = maxCellCount;
  }
  this->m_cellCount = iVar4;
  local_40 = *(undefined8 *)targetSize->m_data;
  local_50 = *(undefined8 *)cellSize->m_data;
  local_58 = *(undefined8 *)(this->m_grid).m_data;
  deRandom_init(&local_38,seed);
  lVar3 = 0;
  *(undefined8 *)(this->m_baseRandomOffset).m_data = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  do {
    local_48[lVar3] = *(int *)((long)&local_58 + lVar3 * 4) * *(int *)((long)&local_50 + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_60[0] = 0;
  local_60[1] = 0;
  lVar3 = 0;
  do {
    local_60[lVar3] = *(int *)((long)&local_40 + lVar3 * 4) - local_48[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  iVar5 = ((local_58._4_4_ - iVar4 / (int)local_58) + -1 + (uint)(iVar4 % (int)local_58 == 0)) *
          local_50._4_4_;
  iVar4 = local_60[0];
  iVar1 = local_60[1];
  local_60[1] = iVar5 + local_60[1];
  dVar2 = deRandom_getUint32(&local_38);
  (this->m_baseRandomOffset).m_data[0] = dVar2 % (iVar4 + 1U);
  dVar2 = deRandom_getUint32(&local_38);
  (this->m_baseRandomOffset).m_data[1] = dVar2 % (iVar5 + iVar1 + 1U);
  return;
}

Assistant:

RandomizedRenderGrid::RandomizedRenderGrid (const IVec2& targetSize, const IVec2& cellSize, int maxCellCount, deUint32 seed)
	: m_targetSize			(targetSize)
	, m_cellSize			(cellSize)
	, m_grid				(targetSize / cellSize)
	, m_currentCell			(0)
	// If the grid exactly fits height, take one row for randomization.
	, m_cellCount			(deMin32(maxCellCount, ((targetSize.y() % cellSize.y()) == 0) && m_grid.y() > 1 ? m_grid.x() * (m_grid.y() - 1) :  m_grid.x() * m_grid.y()))
	, m_baseRandomOffset	(getRandomOffset(seed, targetSize, cellSize, m_grid, m_cellCount))
{
}